

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::BeginPopup(char *str_id,ImGuiWindowFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiID id;
  
  if ((GImGui->BeginPopupStack).Size < (GImGui->OpenPopupStack).Size) {
    id = ImGuiWindow::GetID(GImGui->CurrentWindow,str_id,(char *)0x0);
    bVar2 = BeginPopupEx(id,flags | 0x141);
    return bVar2;
  }
  pIVar1 = GImGui;
  (pIVar1->NextWindowData).CollapsedCond = 0;
  (pIVar1->NextWindowData).SizeConstraintCond = 0;
  (pIVar1->NextWindowData).FocusCond = 0;
  (pIVar1->NextWindowData).BgAlphaCond = 0;
  (pIVar1->NextWindowData).PosCond = 0;
  (pIVar1->NextWindowData).SizeCond = 0;
  (pIVar1->NextWindowData).ContentSizeCond = 0;
  (pIVar1->NextWindowData).CollapsedCond = 0;
  return false;
}

Assistant:

bool ImGui::BeginPopup(const char* str_id, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.Size <= g.BeginPopupStack.Size) // Early out for performance
    {
        g.NextWindowData.Clear(); // We behave like Begin() and need to consume those values
        return false;
    }
    flags |= ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings;
    return BeginPopupEx(g.CurrentWindow->GetID(str_id), flags);
}